

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  unsigned_short uVar1;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *phVar2;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  *phVar3;
  undefined4 uVar4;
  bool bVar5;
  uint8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  crn_thread_id_t cVar11;
  float *pfVar12;
  code *pObject_method;
  tile_details *this_00;
  color_cluster *pcVar13;
  unsigned_short *puVar14;
  value_type *pvVar15;
  alpha_cluster *paVar16;
  bool *pbVar17;
  uint *puVar18;
  unsigned_long_long *puVar19;
  value_type *pvVar20;
  endpoint_indices_details *peVar21;
  selector_indices_details *psVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  uint *local_4a8;
  uint *local_440;
  bool local_433;
  uint local_2ac;
  uint local_258;
  byte local_252;
  bool local_251;
  bool local_245;
  uint local_240;
  uint16 selector_index;
  uint16 endpoint_index;
  uint c_1;
  bool diag_match;
  bool left_match;
  uint uStack_234;
  bool top_match;
  uint bx;
  uint b_1;
  uint by;
  uint block_width;
  uint end_block;
  uint first_block;
  uint level_2;
  insert_result insert_result_3;
  undefined1 local_1f8 [4];
  uint i_5;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  alpha_selectors_map;
  vector<unsigned_short> alpha_selectors_remap;
  undefined1 local_1c0 [8];
  insert_result insert_result_2;
  undefined1 local_1a0 [4];
  uint i_4;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_selectors_map;
  vector<unsigned_short> color_selectors_remap;
  undefined1 local_168 [8];
  insert_result insert_result_1;
  uint32 endpoint_1;
  uint i_3;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  alpha_endpoints_map;
  vector<unsigned_short> alpha_endpoints_remap;
  undefined1 local_110 [8];
  insert_result insert_result;
  uint local_f0;
  uint32 endpoint;
  uint i_2;
  undefined1 local_e0 [8];
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_endpoints_map;
  vector<unsigned_short> color_endpoints_remap;
  uint t;
  uint local_94;
  uint i_1;
  uint bEnd;
  uint b;
  float weight;
  uint level_1;
  uint c;
  uint i;
  uint e_1;
  uint e;
  float adaptive_tile_color_psnr_derating;
  uint level;
  uint tile_derating [8];
  vector<unsigned_int> *alpha_endpoints_local;
  vector<unsigned_int> *color_endpoints_local;
  vector<crnlib::dxt_hc::selector_indices_details> *selector_indices_local;
  vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices_local;
  color_quad_u8 (*blocks_local) [16];
  dxt_hc *this_local;
  
  clear(this);
  local_245 = true;
  if ((((p->m_format != cETC1) && (local_245 = true, p->m_format != cETC2)) &&
      (local_245 = true, p->m_format != cETC2A)) && (local_245 = true, p->m_format != cETC1S)) {
    local_245 = p->m_format == cETC2AS;
  }
  this->m_has_etc_color_blocks = local_245;
  local_251 = true;
  if ((p->m_format != cETC1) && (local_251 = true, p->m_format != cETC2)) {
    local_251 = p->m_format == cETC2A;
  }
  this->m_has_subblocks = local_251;
  local_252 = 1;
  if ((p->m_format != cDXT1) && (local_252 = 1, p->m_format != cDXT5)) {
    local_252 = this->m_has_etc_color_blocks;
  }
  this->m_has_color_blocks = (bool)(local_252 & 1);
  if ((((p->m_format == cDXT5) || (p->m_format == cDXT5A)) || (p->m_format == cETC2A)) ||
     (p->m_format == cETC2AS)) {
    local_258 = 1;
  }
  else {
    bVar23 = true;
    if (p->m_format != cDXN_XY) {
      bVar23 = p->m_format == cDXN_YX;
    }
    local_258 = 0;
    if (bVar23) {
      local_258 = 2;
    }
  }
  this->m_num_alpha_blocks = local_258;
  if (((this->m_has_color_blocks & 1U) == 0) && (this->m_num_alpha_blocks == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this->m_blocks = blocks;
    cVar11 = crn_get_current_thread_id();
    this->m_main_thread_id = cVar11;
    this->m_pTask_pool = p->m_pTask_pool;
    memcpy(&this->m_params,p,0x158);
    _adaptive_tile_color_psnr_derating = 0x100000000;
    tile_derating[0] = 1;
    tile_derating[1] = 2;
    tile_derating[2] = 2;
    tile_derating[3] = 2;
    tile_derating[4] = 2;
    tile_derating[5] = 3;
    for (e = 0; e < p->m_num_levels; e = e + 1) {
      e_1 = (uint)p->m_adaptive_tile_color_psnr_derating;
      if ((e != 0) && (0.25 < (float)e_1)) {
        fVar25 = powf(3.0,(float)e);
        e_1 = (uint)math::maximum<float>(0.25,(float)e_1 / fVar25);
      }
      for (i = 0; i < 8; i = i + 1) {
        fVar25 = math::lerp<float,float>
                           (0.0,(float)e_1,
                            (float)(uint)(&adaptive_tile_color_psnr_derating)[i] / 3.0);
        this->m_color_derating[e][i] = fVar25;
      }
    }
    for (c = 0; c < 8; c = c + 1) {
      fVar25 = math::lerp<float,float>
                         (0.0,(this->m_params).m_adaptive_tile_alpha_psnr_derating,
                          (float)(uint)(&adaptive_tile_color_psnr_derating)[c] / 3.0);
      this->m_alpha_derating[c] = fVar25;
    }
    for (level_1 = 0; level_1 < 0x100; level_1 = level_1 + 1) {
      this->m_uint8_to_float[level_1] = ((float)level_1 * 1.0) / 255.0;
    }
    this->m_num_blocks = (this->m_params).m_num_blocks;
    vector<float>::resize(&this->m_block_weights,this->m_num_blocks,false);
    vector<unsigned_char>::resize(&this->m_block_encodings,this->m_num_blocks,false);
    for (weight = 0.0; (uint)weight < 3; weight = (float)((int)weight + 1)) {
      vector<unsigned_long_long>::resize
                (this->m_block_selectors + (uint)weight,this->m_num_blocks,false);
    }
    vector<unsigned_int>::resize(&this->m_tile_indices,this->m_num_blocks,false);
    vector<crnlib::dxt_hc::endpoint_indices_details>::resize
              (&this->m_endpoint_indices,this->m_num_blocks,false);
    vector<crnlib::dxt_hc::selector_indices_details>::resize
              (&this->m_selector_indices,this->m_num_blocks,false);
    vector<crnlib::dxt_hc::tile_details>::resize(&this->m_tiles,this->m_num_blocks,false);
    for (b = 0; b < p->m_num_levels; b = b + 1) {
      fVar25 = p->m_levels[b].m_weight;
      i_1 = p->m_levels[b].m_first_block;
      uVar7 = i_1 + p->m_levels[b].m_num_blocks;
      for (; i_1 < uVar7; i_1 = i_1 + 1) {
        pfVar12 = vector<float>::operator[](&this->m_block_weights,i_1);
        *pfVar12 = fVar25;
      }
    }
    for (local_94 = 0; uVar8 = task_pool::get_num_threads(this->m_pTask_pool), local_94 <= uVar8;
        local_94 = local_94 + 1) {
      pObject_method = determine_tiles_task;
      if ((this->m_has_subblocks & 1U) != 0) {
        pObject_method = determine_tiles_task_etc;
      }
      task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                (this->m_pTask_pool,this,(offset_in_dxt_hc_to_subr)pObject_method,0,
                 (void *)(ulong)local_94);
    }
    task_pool::join(this->m_pTask_pool);
    this->m_num_tiles = 0;
    for (color_endpoints_remap.m_capacity = 0;
        uVar8 = vector<crnlib::dxt_hc::tile_details>::size(&this->m_tiles),
        color_endpoints_remap.m_capacity < uVar8;
        color_endpoints_remap.m_capacity = color_endpoints_remap.m_capacity + 1) {
      this_00 = vector<crnlib::dxt_hc::tile_details>::operator[]
                          (&this->m_tiles,color_endpoints_remap.m_capacity);
      uVar8 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
      if (uVar8 != 0) {
        this->m_num_tiles = this->m_num_tiles + 1;
      }
    }
    if ((this->m_has_color_blocks & 1U) != 0) {
      determine_color_endpoints(this);
    }
    if (this->m_num_alpha_blocks != 0) {
      determine_alpha_endpoints(this);
    }
    if ((this->m_has_color_blocks & 1U) != 0) {
      create_color_selector_codebook(this);
    }
    if (this->m_num_alpha_blocks != 0) {
      create_alpha_selector_codebook(this);
    }
    uVar8 = vector<unsigned_int>::size(color_endpoints);
    uVar9 = vector<crnlib::dxt_hc::color_cluster>::size(&this->m_color_clusters);
    vector<unsigned_int>::reserve(color_endpoints,uVar8 + uVar9);
    uVar8 = vector<crnlib::dxt_hc::color_cluster>::size(&this->m_color_clusters);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&color_endpoints_map.m_num_valid,uVar8)
    ;
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)local_e0);
    for (local_f0 = 0; uVar8 = vector<crnlib::dxt_hc::color_cluster>::size(&this->m_color_clusters),
        local_f0 < uVar8; local_f0 = local_f0 + 1) {
      pcVar13 = vector<crnlib::dxt_hc::color_cluster>::operator[](&this->m_color_clusters,local_f0);
      uVar8 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&pcVar13->pixels);
      if (uVar8 != 0) {
        if ((this->m_has_etc_color_blocks & 1U) == 0) {
          pcVar13 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                              (&this->m_color_clusters,local_f0);
          uVar8 = pcVar13->first_endpoint;
          pcVar13 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                              (&this->m_color_clusters,local_f0);
          local_2ac = dxt1_block::pack_endpoints(uVar8,pcVar13->second_endpoint);
        }
        else {
          pcVar13 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                              (&this->m_color_clusters,local_f0);
          local_2ac = pcVar13->first_endpoint;
        }
        insert_result._20_4_ = local_2ac;
        alpha_endpoints_remap.m_capacity = vector<unsigned_int>::size(color_endpoints);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)local_110,
                 (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)local_e0,(uint *)&insert_result.field_0x14,&alpha_endpoints_remap.m_capacity);
        if (((byte)insert_result.first.m_index & 1) == 0) {
          pvVar15 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    ::iterator::operator->((iterator *)local_110);
          uVar7 = pvVar15->second;
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&color_endpoints_map.m_num_valid,local_f0);
          *puVar14 = (unsigned_short)uVar7;
        }
        else {
          uVar8 = vector<unsigned_int>::size(color_endpoints);
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&color_endpoints_map.m_num_valid,local_f0);
          *puVar14 = (unsigned_short)uVar8;
          vector<unsigned_int>::push_back(color_endpoints,(uint *)&insert_result.field_0x14);
        }
      }
    }
    uVar8 = vector<unsigned_int>::size(alpha_endpoints);
    uVar9 = vector<crnlib::dxt_hc::alpha_cluster>::size(&this->m_alpha_clusters);
    vector<unsigned_int>::reserve(alpha_endpoints,uVar8 + uVar9);
    uVar8 = vector<crnlib::dxt_hc::alpha_cluster>::size(&this->m_alpha_clusters);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&alpha_endpoints_map.m_num_valid,uVar8)
    ;
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)&endpoint_1);
    for (insert_result_1._20_4_ = 0; uVar4 = insert_result_1._20_4_,
        uVar8 = vector<crnlib::dxt_hc::alpha_cluster>::size(&this->m_alpha_clusters),
        (uint)uVar4 < uVar8; insert_result_1._20_4_ = insert_result_1._20_4_ + 1) {
      paVar16 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                          (&this->m_alpha_clusters,insert_result_1._20_4_);
      uVar8 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&paVar16->pixels);
      if (uVar8 != 0) {
        paVar16 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                            (&this->m_alpha_clusters,insert_result_1._20_4_);
        uVar8 = paVar16->first_endpoint;
        paVar16 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                            (&this->m_alpha_clusters,insert_result_1._20_4_);
        insert_result_1._16_4_ = dxt5_block::pack_endpoints(uVar8,paVar16->second_endpoint);
        color_selectors_remap.m_capacity = vector<unsigned_int>::size(alpha_endpoints);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)local_168,
                 (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)&endpoint_1,(uint *)&insert_result_1.second,&color_selectors_remap.m_capacity);
        if (((byte)insert_result_1.first.m_index & 1) == 0) {
          pvVar15 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    ::iterator::operator->((iterator *)local_168);
          uVar7 = pvVar15->second;
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&alpha_endpoints_map.m_num_valid,
                               insert_result_1._20_4_);
          *puVar14 = (unsigned_short)uVar7;
        }
        else {
          uVar8 = vector<unsigned_int>::size(alpha_endpoints);
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&alpha_endpoints_map.m_num_valid,
                               insert_result_1._20_4_);
          *puVar14 = (unsigned_short)uVar8;
          vector<unsigned_int>::push_back(alpha_endpoints,(uint *)&insert_result_1.second);
        }
      }
    }
    uVar8 = vector<unsigned_int>::size(color_selectors);
    uVar9 = vector<unsigned_int>::size(&this->m_color_selectors);
    vector<unsigned_int>::reserve(color_selectors,uVar8 + uVar9);
    uVar8 = vector<unsigned_int>::size(&this->m_color_selectors);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&color_selectors_map.m_num_valid,uVar8)
    ;
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)local_1a0);
    for (insert_result_2._20_4_ = 0; uVar4 = insert_result_2._20_4_,
        uVar8 = vector<unsigned_int>::size(&this->m_color_selectors), (uint)uVar4 < uVar8;
        insert_result_2._20_4_ = insert_result_2._20_4_ + 1) {
      pbVar17 = vector<bool>::operator[](&this->m_color_selectors_used,insert_result_2._20_4_);
      if ((*pbVar17 & 1U) != 0) {
        puVar18 = vector<unsigned_int>::operator[](&this->m_color_selectors,insert_result_2._20_4_);
        alpha_selectors_remap.m_capacity = vector<unsigned_int>::size(color_selectors);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)local_1c0,
                 (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)local_1a0,puVar18,&alpha_selectors_remap.m_capacity);
        if (((byte)insert_result_2.first.m_index & 1) == 0) {
          pvVar15 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    ::iterator::operator->((iterator *)local_1c0);
          uVar7 = pvVar15->second;
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&color_selectors_map.m_num_valid,
                               insert_result_2._20_4_);
          *puVar14 = (unsigned_short)uVar7;
        }
        else {
          uVar8 = vector<unsigned_int>::size(color_selectors);
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&color_selectors_map.m_num_valid,
                               insert_result_2._20_4_);
          *puVar14 = (unsigned_short)uVar8;
          puVar18 = vector<unsigned_int>::operator[]
                              (&this->m_color_selectors,insert_result_2._20_4_);
          vector<unsigned_int>::push_back(color_selectors,puVar18);
        }
      }
    }
    uVar8 = vector<unsigned_long_long>::size(alpha_selectors);
    uVar9 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
    vector<unsigned_long_long>::reserve(alpha_selectors,uVar8 + uVar9);
    uVar8 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&alpha_selectors_map.m_num_valid,uVar8)
    ;
    hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::hash_map((hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                *)local_1f8);
    for (insert_result_3._20_4_ = 0; uVar4 = insert_result_3._20_4_,
        uVar8 = vector<unsigned_long_long>::size(&this->m_alpha_selectors), (uint)uVar4 < uVar8;
        insert_result_3._20_4_ = insert_result_3._20_4_ + 1) {
      pbVar17 = vector<bool>::operator[](&this->m_alpha_selectors_used,insert_result_3._20_4_);
      if ((*pbVar17 & 1U) != 0) {
        puVar19 = vector<unsigned_long_long>::operator[]
                            (&this->m_alpha_selectors,insert_result_3._20_4_);
        first_block = vector<unsigned_long_long>::size(alpha_selectors);
        hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        ::insert((insert_result *)&level_2,
                 (hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                  *)local_1f8,puVar19,&first_block);
        if (((byte)insert_result_3.first.m_index & 1) == 0) {
          pvVar20 = hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    ::iterator::operator->((iterator *)&level_2);
          uVar7 = pvVar20->second;
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&alpha_selectors_map.m_num_valid,
                               insert_result_3._20_4_);
          *puVar14 = (unsigned_short)uVar7;
        }
        else {
          uVar8 = vector<unsigned_long_long>::size(alpha_selectors);
          puVar14 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&alpha_selectors_map.m_num_valid,
                               insert_result_3._20_4_);
          *puVar14 = (unsigned_short)uVar8;
          puVar19 = vector<unsigned_long_long>::operator[]
                              (&this->m_alpha_selectors,insert_result_3._20_4_);
          vector<unsigned_long_long>::push_back(alpha_selectors,puVar19);
        }
      }
    }
    vector<crnlib::dxt_hc::endpoint_indices_details>::resize
              (endpoint_indices,this->m_num_blocks,false);
    vector<crnlib::dxt_hc::selector_indices_details>::resize
              (selector_indices,this->m_num_blocks,false);
    for (end_block = 0; end_block < p->m_num_levels; end_block = end_block + 1) {
      uStack_234 = p->m_levels[end_block].m_first_block;
      uVar10 = uStack_234 + p->m_levels[end_block].m_num_blocks;
      uVar7 = p->m_levels[end_block].m_block_width;
      bx = 0;
      while (uStack_234 < uVar10) {
        for (c_1 = 0; c_1 < uVar7; c_1 = c_1 + 1) {
          bVar23 = bx != 0;
          local_433 = bVar23 || c_1 != 0;
          bVar24 = false;
          if (((this->m_has_subblocks & 1U) != 0) && (bVar24 = false, bVar23)) {
            bVar24 = c_1 != 0;
          }
          for (local_240 = (uint)((this->m_has_color_blocks & 1U) == 0);
              local_240 < this->m_num_alpha_blocks + 1; local_240 = local_240 + 1) {
            if (local_240 == 0) {
              phVar2 = &color_endpoints_map;
            }
            else {
              phVar2 = &alpha_endpoints_map;
            }
            local_440 = &phVar2->m_num_valid;
            peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                (&this->m_endpoint_indices,uStack_234);
            puVar14 = vector<unsigned_short>::operator[]
                                ((vector<unsigned_short> *)local_440,
                                 (uint)(peVar21->field_0).component[local_240]);
            uVar1 = *puVar14;
            bVar5 = false;
            if (local_433) {
              peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                  (endpoint_indices,uStack_234 - 1);
              bVar5 = uVar1 == (peVar21->field_0).component[local_240];
            }
            local_433 = bVar5;
            bVar5 = false;
            if (bVar23) {
              peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                  (endpoint_indices,uStack_234 - uVar7);
              bVar5 = uVar1 == (peVar21->field_0).component[local_240];
            }
            bVar23 = bVar5;
            bVar5 = false;
            if (bVar24) {
              peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                  (endpoint_indices,~uVar7 + uStack_234);
              bVar5 = uVar1 == (peVar21->field_0).component[local_240];
            }
            bVar24 = bVar5;
            peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                (endpoint_indices,uStack_234);
            (peVar21->field_0).component[local_240] = uVar1;
            if (local_240 == 0) {
              phVar3 = (hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                        *)&color_selectors_map;
            }
            else {
              phVar3 = &alpha_selectors_map;
            }
            local_4a8 = &phVar3->m_num_valid;
            psVar22 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                                (&this->m_selector_indices,uStack_234);
            puVar14 = vector<unsigned_short>::operator[]
                                ((vector<unsigned_short> *)local_4a8,
                                 (uint)(psVar22->field_0).component[local_240]);
            uVar1 = *puVar14;
            psVar22 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                                (selector_indices,uStack_234);
            (psVar22->field_0).component[local_240] = uVar1;
          }
          if (((this->m_has_subblocks & 1U) == 0) || ((uStack_234 & 1) == 0)) {
            if (local_433) {
              uVar6 = '\x01';
            }
            else if (bVar23) {
              uVar6 = '\x02';
            }
            else {
              uVar6 = '\0';
              if (bVar24) {
                uVar6 = '\x03';
              }
            }
          }
          else {
            peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                (&this->m_endpoint_indices,uStack_234);
            uVar6 = peVar21->reference;
          }
          peVar21 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                              (endpoint_indices,uStack_234);
          peVar21->reference = uVar6;
          uStack_234 = uStack_234 + 1;
        }
        bx = bx + 1;
      }
    }
    this->m_pTask_pool = (task_pool *)0x0;
    this_local._7_1_ = true;
    hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::~hash_map((hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                 *)local_1f8);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&alpha_selectors_map.m_num_valid);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)local_1a0);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&color_selectors_map.m_num_valid);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)&endpoint_1);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&alpha_endpoints_map.m_num_valid);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)local_e0);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&color_endpoints_map.m_num_valid);
  }
  return this_local._7_1_;
}

Assistant:

bool dxt_hc::compress(
        color_quad_u8 (*blocks)[16],
        crnlib::vector<endpoint_indices_details>& endpoint_indices,
        crnlib::vector<selector_indices_details>& selector_indices,
        crnlib::vector<uint32>& color_endpoints,
        crnlib::vector<uint32>& alpha_endpoints,
        crnlib::vector<uint32>& color_selectors,
        crnlib::vector<uint64>& alpha_selectors,
        const params& p)
    {
        clear();
        m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
        m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
        m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
        m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2
                                                                                                                                                                               : 0;
        if (!m_has_color_blocks && !m_num_alpha_blocks)
        {
            return false;
        }
        m_blocks = blocks;
        m_main_thread_id = crn_get_current_thread_id();
        m_pTask_pool = p.m_pTask_pool;
        m_params = p;

        uint tile_derating[8] = { 0, 1, 1, 2, 2, 2, 2, 3 };
        for (uint level = 0; level < p.m_num_levels; level++)
        {
            float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
            if (level && adaptive_tile_color_psnr_derating > .25f)
            {
                adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
            }
            for (uint e = 0; e < 8; e++)
            {
                m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
            }
        }
        for (uint e = 0; e < 8; e++)
        {
            m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
        }
        for (uint i = 0; i < 256; i++)
        {
            m_uint8_to_float[i] = i * 1.0f / 255.0f;
        }

        m_num_blocks = m_params.m_num_blocks;
        m_block_weights.resize(m_num_blocks);
        m_block_encodings.resize(m_num_blocks);
        for (uint c = 0; c < 3; c++)
        {
            m_block_selectors[c].resize(m_num_blocks);
        }
        m_tile_indices.resize(m_num_blocks);
        m_endpoint_indices.resize(m_num_blocks);
        m_selector_indices.resize(m_num_blocks);
        m_tiles.resize(m_num_blocks);

        for (uint level = 0; level < p.m_num_levels; level++)
        {
            float weight = p.m_levels[level].m_weight;
            for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
            {
                m_block_weights[b] = weight;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
        }
        m_pTask_pool->join();

        m_num_tiles = 0;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_num_tiles++;
            }
        }

        if (m_has_color_blocks)
        {
            determine_color_endpoints();
        }

        if (m_num_alpha_blocks)
        {
            determine_alpha_endpoints();
        }

        if (m_has_color_blocks)
        {
            create_color_selector_codebook();
        }

        if (m_num_alpha_blocks)
        {
            create_alpha_selector_codebook();
        }

        color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
        crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
        hash_map<uint32, uint> color_endpoints_map;
        for (uint i = 0; i < m_color_clusters.size(); i++)
        {
            if (m_color_clusters[i].pixels.size())
            {
                uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint : dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
                hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
                if (insert_result.second)
                {
                    color_endpoints_remap[i] = color_endpoints.size();
                    color_endpoints.push_back(endpoint);
                }
                else
                {
                    color_endpoints_remap[i] = insert_result.first->second;
                }
            }
        }

        alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
        crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
        hash_map<uint32, uint> alpha_endpoints_map;
        for (uint i = 0; i < m_alpha_clusters.size(); i++)
        {
            if (m_alpha_clusters[i].pixels.size())
            {
                uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
                hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
                if (insert_result.second)
                {
                    alpha_endpoints_remap[i] = alpha_endpoints.size();
                    alpha_endpoints.push_back(endpoint);
                }
                else
                {
                    alpha_endpoints_remap[i] = insert_result.first->second;
                }
            }
        }

        color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
        crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
        hash_map<uint32, uint> color_selectors_map;
        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            if (m_color_selectors_used[i])
            {
                hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
                if (insert_result.second)
                {
                    color_selectors_remap[i] = color_selectors.size();
                    color_selectors.push_back(m_color_selectors[i]);
                }
                else
                {
                    color_selectors_remap[i] = insert_result.first->second;
                }
            }
        }

        alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
        crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
        hash_map<uint64, uint> alpha_selectors_map;
        for (uint i = 0; i < m_alpha_selectors.size(); i++)
        {
            if (m_alpha_selectors_used[i])
            {
                hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
                if (insert_result.second)
                {
                    alpha_selectors_remap[i] = alpha_selectors.size();
                    alpha_selectors.push_back(m_alpha_selectors[i]);
                }
                else
                {
                    alpha_selectors_remap[i] = insert_result.first->second;
                }
            }
        }

        endpoint_indices.resize(m_num_blocks);
        selector_indices.resize(m_num_blocks);
        for (uint level = 0; level < p.m_num_levels; level++)
        {
            uint first_block = p.m_levels[level].m_first_block;
            uint end_block = first_block + p.m_levels[level].m_num_blocks;
            uint block_width = p.m_levels[level].m_block_width;
            for (uint by = 0, b = first_block; b < end_block; by++)
            {
                for (uint bx = 0; bx < block_width; bx++, b++)
                {
                    bool top_match = by != 0;
                    bool left_match = top_match || bx;
                    bool diag_match = m_has_subblocks && top_match && bx;
                    for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
                        left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
                        top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
                        diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
                        endpoint_indices[b].component[c] = endpoint_index;
                        uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
                        selector_indices[b].component[c] = selector_index;
                    }
                    endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1
                        : top_match                                                                                         ? 2
                        : diag_match                                                                                        ? 3
                                                                                                                            : 0;
                }
            }
        }

        m_pTask_pool = nullptr;
        return true;
    }